

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void stl_string_contains_string(void)

{
  Constraint_ *pCVar1;
  string bobbob;
  allocator local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"bobbob",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  pCVar1 = (Constraint_ *)create_contains_string_constraint("obbo","\"obbo\"");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x48,"bobbob",local_20,pCVar1);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

Ensure(stl_string_contains_string) {
    std::string bobbob("bobbob");
    assert_that(bobbob, contains_string("obbo"));
}